

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O2

void __thiscall
cfd::core::MerkleBlock::TraverseAndBuild
          (MerkleBlock *this,uint64_t height,uint64_t pos,
          vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids,
          vector<bool,_std::allocator<bool>_> *matches)

{
  const_reference cVar1;
  ulong uVar2;
  uint64_t height_00;
  bool bVar3;
  bool bVar4;
  Txid local_a0;
  _Bvector_base<std::allocator<bool>_> local_80;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  uVar2 = pos << ((byte)height & 0x3f);
  do {
    bVar3 = uVar2 < pos + 1 << ((byte)height & 0x3f);
    bVar4 = uVar2 < this->transaction_count;
    if (!bVar4 || !bVar3) break;
    cVar1 = ::std::vector<bool,_std::allocator<bool>_>::operator[](matches,uVar2);
    uVar2 = uVar2 + 1;
  } while (!cVar1);
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)&this->bits_,bVar4 && bVar3);
  if (height == 0 || (!bVar4 || !bVar3)) {
    CalculateHash(&local_a0,this,height,pos,txids);
    ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::emplace_back<cfd::core::Txid>
              (&this->txids_,&local_a0);
    Txid::~Txid(&local_a0);
  }
  else {
    height_00 = height - 1;
    ::std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_58,matches);
    TraverseAndBuild(this,height_00,pos * 2,txids,(vector<bool,_std::allocator<bool>_> *)&local_58);
    ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
    uVar2 = pos * 2 | 1;
    if (uVar2 < ~(-1L << ((byte)height_00 & 0x3f)) + this->transaction_count >>
                ((byte)height_00 & 0x3f)) {
      ::std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&local_80,matches);
      TraverseAndBuild(this,height_00,uVar2,txids,(vector<bool,_std::allocator<bool>_> *)&local_80);
      ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_80);
    }
  }
  return;
}

Assistant:

void MerkleBlock::TraverseAndBuild(
    uint64_t height, uint64_t pos, const std::vector<Txid>& txids,
    const std::vector<bool> matches) {
  bool has_parent_of_match = false;
  for (uint64_t index = pos << height;
       (index < ((pos + 1) << height)) && (index < transaction_count);
       ++index) {
    if (matches[index]) {
      has_parent_of_match = true;
      break;
    }
  }
  bits_.push_back(has_parent_of_match);
  if ((height == 0) || (!has_parent_of_match)) {
    // if at height 0, or nothing interesting below, store hash and stop
    txids_.push_back(CalculateHash(height, pos, txids));
  } else {
    TraverseAndBuild(height - 1, pos * 2, txids, matches);
    if ((pos * 2 + 1) < CalcTreeWidth(transaction_count, height - 1)) {
      TraverseAndBuild(height - 1, pos * 2 + 1, txids, matches);
    }
  }
}